

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

uint32_t countint(cTValue *key,uint32_t *bins)

{
  double dVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar3 = 0;
  if ((key->field_2).it < 0xfffeffff) {
    dVar1 = key->n;
    uVar4 = (uint)dVar1;
    if (((uVar4 < 0x8000001) && (dVar1 == (double)(int)dVar1)) &&
       (!NAN(dVar1) && !NAN((double)(int)dVar1))) {
      uVar2 = 0x1f;
      if (uVar4 - 1 != 0) {
        for (; uVar4 - 1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar5 = 0;
      if (2 < uVar4) {
        uVar5 = (ulong)uVar2;
      }
      bins[uVar5] = bins[uVar5] + 1;
      uVar3 = 1;
    }
  }
  return uVar3;
}

Assistant:

static uint32_t countint(cTValue *key, uint32_t *bins)
{
  lj_assertX(!tvisint(key), "bad integer key");
  if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if ((uint32_t)k < LJ_MAX_ASIZE && nk == (lua_Number)k) {
      bins[(k > 2 ? lj_fls((uint32_t)(k-1)) : 0)]++;
      return 1;
    }
  }
  return 0;
}